

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_err_delete_internal(mpc_input_t *i,mpc_err_t *x)

{
  long lVar1;
  
  if (x != (mpc_err_t *)0x0) {
    for (lVar1 = 0; lVar1 < x->expected_num; lVar1 = lVar1 + 1) {
      mpc_free(i,x->expected[lVar1]);
    }
    mpc_free(i,x->expected);
    mpc_free(i,x->filename);
    mpc_free(i,x->failure);
    mpc_free(i,x);
    return;
  }
  return;
}

Assistant:

static void mpc_err_delete_internal(mpc_input_t *i, mpc_err_t *x) {
  int j;
  if (x == NULL) { return; }
  for (j = 0; j < x->expected_num; j++) { mpc_free(i, x->expected[j]); }
  mpc_free(i, x->expected);
  mpc_free(i, x->filename);
  mpc_free(i, x->failure);
  mpc_free(i, x);
}